

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

mp_int * mp_invert_mod_2to(mp_int *x,size_t p)

{
  BignumInt *pBVar1;
  ulong uVar2;
  size_t i;
  mp_int *pmVar3;
  mp_int *pmVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  BignumInt BVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  BignumInt *pBVar17;
  BignumInt *pBVar18;
  size_t inlen;
  ulong uVar19;
  size_t nw;
  mp_int scratch;
  mp_int scratch_00;
  mp_int scratch_01;
  mp_int r0;
  mp_int x1;
  mp_int K;
  mp_int r1;
  mp_int r0x1;
  mp_int Kshift;
  mp_int x0;
  mp_int local_c8;
  mp_int *local_b8;
  ulong local_b0;
  size_t local_a8;
  BignumInt *local_a0;
  BignumInt *local_98;
  mp_int local_90;
  mp_int local_80;
  mp_int local_70;
  mp_int local_60;
  mp_int local_50;
  mp_int local_40;
  
  if (x->nw == 0) {
    __assert_fail("x->nw > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x50a,"mp_int *mp_invert_mod_2to(mp_int *, size_t)");
  }
  if ((*x->w & 1) == 0) {
    __assert_fail("x->w[0] & 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x50b,"mp_int *mp_invert_mod_2to(mp_int *, size_t)");
  }
  if (p == 0) {
    __assert_fail("p > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c"
                  ,0x50c,"mp_int *mp_invert_mod_2to(mp_int *, size_t)");
  }
  uVar19 = p + 0x3f >> 6;
  nw = uVar19 + (uVar19 == 0);
  pmVar3 = mp_make_sized(nw);
  uVar16 = nw * 6;
  pmVar4 = mp_make_sized(nw * 0xc);
  uVar19 = pmVar4->nw;
  uVar7 = uVar19 + nw * -6;
  if (uVar16 <= uVar19) {
    if (uVar7 < uVar19) {
      uVar19 = uVar7;
    }
    pBVar1 = pmVar4->w;
    pBVar17 = pmVar3->w;
    *pBVar17 = 1;
    local_b8 = pmVar4;
    if (p == 1) {
      sVar12 = pmVar3->nw;
    }
    else {
      local_a0 = pBVar1 + nw * 6;
      uVar7 = 1;
      local_b0 = uVar19;
      local_a8 = p;
      do {
        pBVar17 = local_a0;
        uVar19 = uVar7 + 0x3f >> 6;
        if (local_b0 < uVar19) goto LAB_001596d1;
        uVar11 = local_b0 - uVar19;
        if (local_b0 <= local_b0 - uVar19) {
          uVar11 = local_b0;
        }
        local_40.w = local_a0;
        uVar13 = x->nw;
        if (uVar19 < x->nw) {
          uVar13 = uVar19;
        }
        local_40.nw = uVar19;
        memmove(local_a0,x->w,uVar13 * 8);
        smemclr(pBVar17 + uVar13,(uVar19 - uVar13) * 8);
        uVar13 = uVar7 >> 6;
        if (uVar13 < uVar19) {
          uVar5 = ~(-1L << ((byte)uVar7 & 0x3f));
          uVar10 = uVar13;
          do {
            pBVar17[uVar10] = pBVar17[uVar10] & uVar5;
            uVar10 = uVar10 + 1;
            uVar5 = 0;
          } while (uVar19 != uVar10);
        }
        uVar10 = uVar7 * 2 + 0x3f >> 6;
        local_c8.w = pmVar3->w;
        local_c8.nw = pmVar3->nw;
        if (uVar19 <= pmVar3->nw) {
          local_c8.nw = uVar19;
        }
        if (uVar11 < uVar10) goto LAB_001596d1;
        pBVar17 = pBVar17 + uVar19;
        if (uVar11 - uVar10 < uVar11) {
          uVar11 = uVar11 - uVar10;
        }
        scratch.w = pBVar1;
        scratch.nw = uVar16;
        local_50.nw = uVar10;
        local_50.w = pBVar17;
        mp_mul_internal(&local_50,&local_40,&local_c8,scratch);
        uVar5 = uVar11 - uVar19;
        if (uVar11 < uVar19) goto LAB_001596d1;
        pBVar18 = pBVar17 + uVar10;
        local_80.nw = uVar19;
        local_80.w = pBVar18;
        mp_rshift_fixed_into(&local_80,&local_50,uVar7);
        if (uVar5 < uVar19) goto LAB_001596d1;
        if (uVar5 < uVar11) {
          uVar11 = uVar5;
        }
        local_98 = pBVar18 + uVar19;
        uVar5 = uVar11 - uVar19;
        if (uVar11 <= uVar11 - uVar19) {
          uVar5 = uVar11;
        }
        local_90.nw = uVar19;
        local_90.w = local_98;
        mp_rshift_fixed_into(&local_90,x,uVar7);
        if (uVar13 < uVar19) {
          uVar11 = ~(-1L << ((byte)uVar7 & 0x3f));
          lVar14 = 0;
          do {
            pBVar1[nw * 6 + uVar10 + uVar13 + uVar19 * 2 + lVar14] =
                 pBVar1[nw * 6 + uVar10 + uVar13 + uVar19 * 2 + lVar14] & uVar11;
            lVar14 = lVar14 + 1;
            uVar11 = 0;
          } while (uVar19 - uVar13 != lVar14);
        }
        uVar11 = uVar19;
        if (uVar10 < uVar19) {
          uVar11 = uVar10;
        }
        scratch_00.w = pBVar1;
        scratch_00.nw = uVar16;
        local_60.nw = uVar11;
        local_60.w = pBVar17;
        mp_mul_internal(&local_60,&local_c8,&local_90,scratch_00);
        if (uVar11 != 0) {
          uVar15 = 0;
          uVar6 = 0;
          do {
            uVar2 = pBVar17[uVar6];
            if (uVar6 < uVar19) {
              BVar8 = uVar2 + uVar15 + pBVar18[uVar6];
              uVar15 = (ulong)CARRY8(uVar2,uVar15) + (ulong)CARRY8(uVar2 + uVar15,pBVar18[uVar6]);
            }
            else {
              BVar8 = uVar2 + uVar15;
              uVar15 = (ulong)CARRY8(uVar2,uVar15);
            }
            pBVar17[uVar6] = BVar8;
            uVar6 = uVar6 + 1;
          } while (uVar11 != uVar6);
          uVar15 = 1;
          uVar6 = 0;
          do {
            BVar8 = ~pBVar17[uVar6] + uVar15;
            uVar15 = (ulong)CARRY8(~pBVar17[uVar6],uVar15);
            pBVar17[uVar6] = BVar8;
            uVar6 = uVar6 + 1;
          } while (uVar11 != uVar6);
        }
        if (uVar5 < uVar19) goto LAB_001596d1;
        local_70.w = local_98 + uVar19;
        scratch_01.w = pBVar1;
        scratch_01.nw = uVar16;
        local_70.nw = uVar19;
        mp_mul_internal(&local_70,&local_c8,&local_60,scratch_01);
        uVar9 = (uint)uVar7 & 0x3f;
        if (uVar13 < uVar19) {
          uVar11 = ~(-1L << (sbyte)uVar9);
          lVar14 = 0;
          do {
            pBVar1[nw * 6 + uVar10 + uVar19 * 3 + uVar13 + lVar14] =
                 pBVar1[nw * 6 + uVar10 + uVar19 * 3 + uVar13 + lVar14] & uVar11;
            lVar14 = lVar14 + 1;
            uVar11 = 0;
          } while (uVar19 - uVar13 != lVar14);
        }
        mp_lshift_fixed_into(&local_80,&local_70,(ulong)uVar9);
        sVar12 = pmVar3->nw;
        pBVar17 = pmVar3->w;
        uVar11 = uVar13;
        if (sVar12 < uVar13) {
          uVar11 = sVar12;
        }
        uVar5 = sVar12 - uVar11;
        if (uVar10 - uVar13 <= sVar12 - uVar11) {
          uVar5 = uVar10 - uVar13;
        }
        if (uVar5 != 0) {
          uVar10 = 0;
          uVar13 = 0;
          do {
            if (uVar13 < uVar19) {
              BVar8 = pBVar18[uVar13];
            }
            else {
              BVar8 = 0;
            }
            uVar6 = uVar10 + pBVar17[uVar11 + uVar13];
            uVar10 = (ulong)CARRY8(uVar10,pBVar17[uVar11 + uVar13]) + (ulong)CARRY8(uVar6,BVar8);
            pBVar17[uVar11 + uVar13] = uVar6 + BVar8;
            uVar13 = uVar13 + 1;
          } while (uVar5 != uVar13);
        }
        uVar7 = uVar7 * 2;
        p = local_a8;
      } while (uVar7 < local_a8);
    }
    uVar19 = p >> 6;
    if (uVar19 < sVar12) {
      uVar16 = ~(-1L << ((byte)p & 0x3f));
      do {
        pBVar17[uVar19] = pBVar17[uVar19] & uVar16;
        uVar19 = uVar19 + 1;
        uVar16 = 0;
      } while (sVar12 != uVar19);
    }
    mp_free(local_b8);
    return pmVar3;
  }
LAB_001596d1:
  __assert_fail("len <= pool->nw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                699,"mp_int mp_alloc_from_scratch(mp_int *, size_t)");
}

Assistant:

mp_int *mp_invert_mod_2to(mp_int *x, size_t p)
{
    /* Input checks: x must be coprime to the modulus, i.e. odd, and p
     * can't be zero */
    assert(x->nw > 0);
    assert(x->w[0] & 1);
    assert(p > 0);

    size_t rw = (p + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;
    rw = size_t_max(rw, 1);
    mp_int *r = mp_make_sized(rw);

    size_t mul_scratchsize = mp_mul_scratchspace(2*rw, rw, rw);
    mp_int *scratch_orig = mp_make_sized(6 * rw + mul_scratchsize);
    mp_int scratch_per_iter = *scratch_orig;
    mp_int mul_scratch = mp_alloc_from_scratch(
        &scratch_per_iter, mul_scratchsize);

    r->w[0] = 1;

    for (size_t b = 1; b < p; b <<= 1) {
        /*
         * In each step of this iteration, we have the inverse of x
         * mod 2^b, and we want the inverse of x mod 2^{2b}.
         *
         * Write B = 2^b for convenience, so we want x^{-1} mod B^2.
         * Let x = x_0 + B x_1 + k B^2, with 0 <= x_0,x_1 < B.
         *
         * We want to find r_0 and r_1 such that
         *    (r_1 B + r_0) (x_1 B + x_0) == 1 (mod B^2)
         *
         * To begin with, we know r_0 must be the inverse mod B of
         * x_0, i.e. of x, i.e. it is the inverse we computed in the
         * previous iteration. So now all we need is r_1.
         *
         * Multiplying out, neglecting multiples of B^2, and writing
         * x_0 r_0 = K B + 1, we have
         *
         *    r_1 x_0 B + r_0 x_1 B + K B == 0                    (mod B^2)
         * =>                   r_1 x_0 B == - r_0 x_1 B - K B    (mod B^2)
         * =>                     r_1 x_0 == - r_0 x_1 - K        (mod B)
         * =>                         r_1 == r_0 (- r_0 x_1 - K)  (mod B)
         *
         * (the last step because we multiply through by the inverse
         * of x_0, which we already know is r_0).
         */

        mp_int scratch_this_iter = scratch_per_iter;
        size_t Bw = (b + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;
        size_t B2w = (2*b + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS;

        /* Start by finding K: multiply x_0 by r_0, and shift down. */
        mp_int x0 = mp_alloc_from_scratch(&scratch_this_iter, Bw);
        mp_copy_into(&x0, x);
        mp_reduce_mod_2to(&x0, b);
        mp_int r0 = mp_make_alias(r, 0, Bw);
        mp_int Kshift = mp_alloc_from_scratch(&scratch_this_iter, B2w);
        mp_mul_internal(&Kshift, &x0, &r0, mul_scratch);
        mp_int K = mp_alloc_from_scratch(&scratch_this_iter, Bw);
        mp_rshift_fixed_into(&K, &Kshift, b);

        /* Now compute the product r_0 x_1, reusing the space of Kshift. */
        mp_int x1 = mp_alloc_from_scratch(&scratch_this_iter, Bw);
        mp_rshift_fixed_into(&x1, x, b);
        mp_reduce_mod_2to(&x1, b);
        mp_int r0x1 = mp_make_alias(&Kshift, 0, Bw);
        mp_mul_internal(&r0x1, &r0, &x1, mul_scratch);

        /* Add K to that. */
        mp_add_into(&r0x1, &r0x1, &K);

        /* Negate it. */
        mp_neg_into(&r0x1, &r0x1);

        /* Multiply by r_0. */
        mp_int r1 = mp_alloc_from_scratch(&scratch_this_iter, Bw);
        mp_mul_internal(&r1, &r0, &r0x1, mul_scratch);
        mp_reduce_mod_2to(&r1, b);

        /* That's our r_1, so add it on to r_0 to get the full inverse
         * output from this iteration. */
        mp_lshift_fixed_into(&K, &r1, (b % BIGNUM_INT_BITS));
        size_t Bpos = b / BIGNUM_INT_BITS;
        mp_int r1_position = mp_make_alias(r, Bpos, B2w-Bpos);
        mp_add_into(&r1_position, &r1_position, &K);
    }

    /* Finally, reduce mod the precise desired number of bits. */
    mp_reduce_mod_2to(r, p);

    mp_free(scratch_orig);
    return r;
}